

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderModule.cpp
# Opt level: O1

Ptr<ShaderModule> __thiscall
myvk::ShaderModule::Create(ShaderModule *this,Ptr<Device> *device,uint32_t *code,uint32_t code_size)

{
  element_type *peVar1;
  VkResult VVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Ptr<ShaderModule> PVar4;
  shared_ptr<myvk::ShaderModule> ret;
  VkShaderModuleCreateInfo info;
  _func_int **local_68;
  element_type *peStack_60;
  VkShaderModuleCreateInfo local_58;
  
  std::__shared_ptr<myvk::ShaderModule,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::ShaderModule>>
            ((__shared_ptr<myvk::ShaderModule,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (allocator<myvk::ShaderModule> *)&local_58);
  local_68[3] = (_func_int *)
                (device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 4),
             &(device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_58.pNext = (void *)0x0;
  local_58.flags = 0;
  local_58._20_4_ = 0;
  local_58.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_58._4_4_ = 0;
  local_58.codeSize = (size_t)code_size;
  local_58.pCode = code;
  VVar2 = (*vkCreateShaderModule)
                    (((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                     ->m_device,&local_58,(VkAllocationCallbacks *)0x0,
                     (VkShaderModule *)(local_68 + 5));
  peVar1 = peStack_60;
  if (VVar2 == VK_SUCCESS) {
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    peStack_60 = (element_type *)0x0;
    (this->super_DeviceObjectBase).super_Base._vptr_Base = local_68;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    local_68 = (_func_int **)0x0;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  _Var3._M_pi = extraout_RDX;
  if (peStack_60 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_60);
    _Var3._M_pi = extraout_RDX_00;
  }
  PVar4.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  PVar4.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<ShaderModule>)PVar4.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ptr<ShaderModule> ShaderModule::Create(const Ptr<Device> &device, const uint32_t *code, uint32_t code_size) {
	auto ret = std::make_shared<ShaderModule>();
	ret->m_device_ptr = device;

	VkShaderModuleCreateInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
	info.pCode = code;
	info.codeSize = code_size;
	if (vkCreateShaderModule(device->GetHandle(), &info, nullptr, &ret->m_shader_module) != VK_SUCCESS)
		return nullptr;
	return ret;
}